

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_listener_unregister_tricore(MemoryListener *listener)

{
  AddressSpace *pAVar1;
  FlatView *fv;
  QTailQLink *pQVar2;
  anon_union_16_2_aaf24f3d_for_link *paVar3;
  anon_union_16_2_aaf24f3d_for_link_as *paVar4;
  FlatRange *pFVar5;
  FlatRange *fr;
  MemoryRegionSection MStack_68;
  
  pAVar1 = listener->address_space;
  if (pAVar1 != (AddressSpace *)0x0) {
    if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
      (*listener->begin)(listener);
    }
    fv = pAVar1->current_map;
    pFVar5 = fv->ranges;
    for (fr = pFVar5; fr < pFVar5 + fv->nr; fr = fr + 1) {
      section_from_flat_range(&MStack_68,fr,fv);
      if (listener->region_del != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
        (*listener->region_del)(listener,&MStack_68);
      }
      pFVar5 = fv->ranges;
    }
    if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
      (*listener->commit)(listener);
    }
    pQVar2 = (listener->link).tqe_circ.tql_prev;
    if ((listener->link).tqe_next == (MemoryListener *)0x0) {
      paVar3 = (anon_union_16_2_aaf24f3d_for_link *)&listener->address_space->uc->memory_listeners;
    }
    else {
      paVar3 = &((listener->link).tqe_next)->link;
    }
    (paVar3->tqe_circ).tql_prev = pQVar2;
    pQVar2->tql_next = (listener->link).tqe_next;
    (listener->link).tqe_next = (MemoryListener *)0x0;
    (listener->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    pQVar2 = (listener->link_as).tqe_circ.tql_prev;
    if ((listener->link_as).tqe_next == (MemoryListener *)0x0) {
      paVar4 = (anon_union_16_2_aaf24f3d_for_link_as *)&listener->address_space->listeners;
    }
    else {
      paVar4 = &((listener->link_as).tqe_next)->link_as;
    }
    (paVar4->tqe_circ).tql_prev = pQVar2;
    pQVar2->tql_next = (listener->link_as).tqe_next;
    listener->address_space = (AddressSpace *)0x0;
    (listener->link_as).tqe_next = (MemoryListener *)0x0;
    (listener->link_as).tqe_circ.tql_prev = (QTailQLink *)0x0;
  }
  return;
}

Assistant:

void memory_listener_unregister(MemoryListener *listener)
{
    if (!listener->address_space) {
        return;
    }

    listener_del_address_space(listener, listener->address_space);
    QTAILQ_REMOVE(&listener->address_space->uc->memory_listeners, listener, link);
    QTAILQ_REMOVE(&listener->address_space->listeners, listener, link_as);
    listener->address_space = NULL;
}